

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,Filters filters)

{
  bool bVar1;
  QDebug *this;
  QListSpecialMethods<QString> *this_00;
  QDebugStateSaver *this_01;
  undefined4 in_EDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  QStringList flags;
  QDebugStateSaver save;
  undefined4 in_stack_fffffffffffffc58;
  Filter in_stack_fffffffffffffc5c;
  char t;
  QList<QString> *in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffc68;
  QString *in_stack_fffffffffffffc70;
  QChar sep;
  Stream *pSVar3;
  QLatin1StringView in_stack_fffffffffffffc90;
  char *local_350;
  QChar local_242 [27];
  QFlagsStorageHelper<QDir::Filter,_4> local_20c;
  QFlagsStorageHelper<QDir::Filter,_4> local_1ec;
  QFlagsStorageHelper<QDir::Filter,_4> local_1cc;
  QFlagsStorageHelper<QDir::Filter,_4> local_1ac;
  QFlagsStorageHelper<QDir::Filter,_4> local_18c;
  QFlagsStorageHelper<QDir::Filter,_4> local_16c;
  QFlagsStorageHelper<QDir::Filter,_4> local_14c;
  QFlagsStorageHelper<QDir::Filter,_4> local_114;
  QFlagsStorageHelper<QDir::Filter,_4> local_f4;
  QFlagsStorageHelper<QDir::Filter,_4> local_d4;
  QFlagsStorageHelper<QDir::Filter,_4> local_b4;
  QFlagsStorageHelper<QDir::Filter,_4> local_94;
  QFlagsStorageHelper<QDir::Filter,_4> local_74;
  QFlagsStorageHelper<QDir::Filter,_4> local_54;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  pSVar3 = in_RDI;
  local_c = in_EDX;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)in_RDI,(QDebug *)in_RDI);
  sep.ucs = (char16_t)((ulong)in_RDI >> 0x30);
  QDebug::resetFormat((QDebug *)in_stack_fffffffffffffc60);
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x28338a);
  local_34 = local_c;
  bVar1 = operator==((QFlagsStorageHelper<QDir::Filter,_4>)
                     SUB84((ulong)in_stack_fffffffffffffc68 >> 0x20,0),
                     (Filter)in_stack_fffffffffffffc60);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____L1
              (in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
    QString::QString(in_stack_fffffffffffffc70,in_stack_fffffffffffffc90);
    QList<QString>::operator<<
              (in_stack_fffffffffffffc60,
               (rvalue_ref)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    t = (char)((uint)in_stack_fffffffffffffc5c >> 0x18);
    QString::~QString((QString *)0x283416);
  }
  else {
    local_54.super_QFlagsStorage<QDir::Filter>.i =
         (QFlagsStorage<QDir::Filter>)
         QFlags<QDir::Filter>::operator&
                   ((QFlags<QDir::Filter> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_54);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
      QString::QString(in_stack_fffffffffffffc70,in_stack_fffffffffffffc90);
      QList<QString>::operator<<
                (in_stack_fffffffffffffc60,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      QString::~QString((QString *)0x283512);
    }
    local_74.super_QFlagsStorage<QDir::Filter>.i =
         (QFlagsStorage<QDir::Filter>)
         QFlags<QDir::Filter>::operator&
                   ((QFlags<QDir::Filter> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_74);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
      QString::QString(in_stack_fffffffffffffc70,in_stack_fffffffffffffc90);
      QList<QString>::operator<<
                (in_stack_fffffffffffffc60,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      QString::~QString((QString *)0x2835d1);
    }
    local_94.super_QFlagsStorage<QDir::Filter>.i =
         (QFlagsStorage<QDir::Filter>)
         QFlags<QDir::Filter>::operator&
                   ((QFlags<QDir::Filter> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_94);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
      QString::QString(in_stack_fffffffffffffc70,in_stack_fffffffffffffc90);
      QList<QString>::operator<<
                (in_stack_fffffffffffffc60,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      QString::~QString((QString *)0x283690);
    }
    local_b4.super_QFlagsStorage<QDir::Filter>.i =
         (QFlagsStorage<QDir::Filter>)
         QFlags<QDir::Filter>::operator&
                   ((QFlags<QDir::Filter> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_b4);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
      QString::QString(in_stack_fffffffffffffc70,in_stack_fffffffffffffc90);
      QList<QString>::operator<<
                (in_stack_fffffffffffffc60,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      QString::~QString((QString *)0x28374f);
    }
    local_d4.super_QFlagsStorage<QDir::Filter>.i =
         (QFlagsStorage<QDir::Filter>)
         QFlags<QDir::Filter>::operator&
                   ((QFlags<QDir::Filter> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_d4);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
      QString::QString(in_stack_fffffffffffffc70,in_stack_fffffffffffffc90);
      QList<QString>::operator<<
                (in_stack_fffffffffffffc60,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      QString::~QString((QString *)0x28380e);
    }
    local_f4.super_QFlagsStorage<QDir::Filter>.i =
         (QFlagsStorage<QDir::Filter>)
         QFlags<QDir::Filter>::operator&
                   ((QFlags<QDir::Filter> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_f4);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
      QString::QString(in_stack_fffffffffffffc70,in_stack_fffffffffffffc90);
      QList<QString>::operator<<
                (in_stack_fffffffffffffc60,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      QString::~QString((QString *)0x2838cd);
    }
    local_114.super_QFlagsStorage<QDir::Filter>.i =
         (QFlagsStorage<QDir::Filter>)
         QFlags<QDir::Filter>::operator&
                   ((QFlags<QDir::Filter> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_114);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
      QString::QString(in_stack_fffffffffffffc70,in_stack_fffffffffffffc90);
      QList<QString>::operator<<
                (in_stack_fffffffffffffc60,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      QString::~QString((QString *)0x28398c);
    }
    QFlags<QDir::Filter>::operator&
              ((QFlags<QDir::Filter> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    bVar1 = operator==((QFlagsStorageHelper<QDir::Filter,_4>)
                       SUB84((ulong)in_stack_fffffffffffffc68 >> 0x20,0),
                       (Filter)in_stack_fffffffffffffc60);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
      QString::QString(in_stack_fffffffffffffc70,in_stack_fffffffffffffc90);
      QList<QString>::operator<<
                (in_stack_fffffffffffffc60,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      QString::~QString((QString *)0x283a4f);
    }
    local_14c.super_QFlagsStorage<QDir::Filter>.i =
         (QFlagsStorage<QDir::Filter>)
         QFlags<QDir::Filter>::operator&
                   ((QFlags<QDir::Filter> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_14c);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
      QString::QString(in_stack_fffffffffffffc70,in_stack_fffffffffffffc90);
      QList<QString>::operator<<
                (in_stack_fffffffffffffc60,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      QString::~QString((QString *)0x283b0e);
    }
    local_16c.super_QFlagsStorage<QDir::Filter>.i =
         (QFlagsStorage<QDir::Filter>)
         QFlags<QDir::Filter>::operator&
                   ((QFlags<QDir::Filter> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_16c);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
      QString::QString(in_stack_fffffffffffffc70,in_stack_fffffffffffffc90);
      QList<QString>::operator<<
                (in_stack_fffffffffffffc60,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      QString::~QString((QString *)0x283bcd);
    }
    local_18c.super_QFlagsStorage<QDir::Filter>.i =
         (QFlagsStorage<QDir::Filter>)
         QFlags<QDir::Filter>::operator&
                   ((QFlags<QDir::Filter> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_18c);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
      QString::QString(in_stack_fffffffffffffc70,in_stack_fffffffffffffc90);
      QList<QString>::operator<<
                (in_stack_fffffffffffffc60,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      QString::~QString((QString *)0x283c86);
    }
    local_1ac.super_QFlagsStorage<QDir::Filter>.i =
         (QFlagsStorage<QDir::Filter>)
         QFlags<QDir::Filter>::operator&
                   ((QFlags<QDir::Filter> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_1ac);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
      QString::QString(in_stack_fffffffffffffc70,in_stack_fffffffffffffc90);
      QList<QString>::operator<<
                (in_stack_fffffffffffffc60,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      QString::~QString((QString *)0x283d39);
    }
    local_1cc.super_QFlagsStorage<QDir::Filter>.i =
         (QFlagsStorage<QDir::Filter>)
         QFlags<QDir::Filter>::operator&
                   ((QFlags<QDir::Filter> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_1cc);
    if (bVar1) {
      QVar2 = Qt::Literals::StringLiterals::operator____L1
                        (in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
      local_350 = QVar2.m_data;
      QString::QString(in_stack_fffffffffffffc70,in_stack_fffffffffffffc90);
      QList<QString>::operator<<
                (in_stack_fffffffffffffc60,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      QString::~QString((QString *)0x283dec);
    }
    local_1ec.super_QFlagsStorage<QDir::Filter>.i =
         (QFlagsStorage<QDir::Filter>)
         QFlags<QDir::Filter>::operator&
                   ((QFlags<QDir::Filter> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_1ec);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                (in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
      QString::QString(in_stack_fffffffffffffc70,in_stack_fffffffffffffc90);
      QList<QString>::operator<<
                (in_stack_fffffffffffffc60,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      QString::~QString((QString *)0x283e9f);
    }
    local_20c.super_QFlagsStorage<QDir::Filter>.i =
         (QFlagsStorage<QDir::Filter>)
         QFlags<QDir::Filter>::operator&
                   ((QFlags<QDir::Filter> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_20c);
    if (bVar1) {
      QVar2 = Qt::Literals::StringLiterals::operator____L1
                        (in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
      QString::QString(in_stack_fffffffffffffc70,QVar2);
      QList<QString>::operator<<
                (in_stack_fffffffffffffc60,
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      QString::~QString((QString *)0x283f52);
    }
    t = (char)((uint)in_stack_fffffffffffffc5c >> 0x18);
  }
  this = QDebug::noquote(in_RSI);
  this_00 = (QListSpecialMethods<QString> *)QDebug::operator<<(in_RSI,local_350);
  QChar::QChar<char16_t,_true>(local_242,L'|');
  QListSpecialMethods<QString>::join(this_00,sep);
  this_01 = (QDebugStateSaver *)QDebug::operator<<(this,(QString *)this_00);
  QDebug::operator<<((QDebug *)this_01,t);
  QString::~QString((QString *)0x284011);
  QDebug::QDebug(this,(QDebug *)this_00);
  QList<QString>::~QList((QList<QString> *)0x28402d);
  QDebugStateSaver::~QDebugStateSaver(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDebug)pSVar3;
}

Assistant:

QDebug operator<<(QDebug debug, QDir::Filters filters)
{
    QDebugStateSaver save(debug);
    debug.resetFormat();
    QStringList flags;
    if (filters == QDir::NoFilter) {
        flags << "NoFilter"_L1;
    } else {
        if (filters & QDir::Dirs) flags << "Dirs"_L1;
        if (filters & QDir::AllDirs) flags << "AllDirs"_L1;
        if (filters & QDir::Files) flags << "Files"_L1;
        if (filters & QDir::Drives) flags << "Drives"_L1;
        if (filters & QDir::NoSymLinks) flags << "NoSymLinks"_L1;
        if (filters & QDir::NoDot) flags << "NoDot"_L1;
        if (filters & QDir::NoDotDot) flags << "NoDotDot"_L1;
        if ((filters & QDir::AllEntries) == QDir::AllEntries) flags << "AllEntries"_L1;
        if (filters & QDir::Readable) flags << "Readable"_L1;
        if (filters & QDir::Writable) flags << "Writable"_L1;
        if (filters & QDir::Executable) flags << "Executable"_L1;
        if (filters & QDir::Modified) flags << "Modified"_L1;
        if (filters & QDir::Hidden) flags << "Hidden"_L1;
        if (filters & QDir::System) flags << "System"_L1;
        if (filters & QDir::CaseSensitive) flags << "CaseSensitive"_L1;
    }
    debug.noquote() << "QDir::Filters(" << flags.join(u'|') << ')';
    return debug;
}